

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t parse_filter(archive_read *ar,uint8_t *p)

{
  wchar_t wVar1;
  wchar_t local_48;
  wchar_t local_44;
  wchar_t channels;
  wchar_t ret;
  rar5 *rar;
  filter_info *filt;
  uint local_28;
  uint32_t uStack_24;
  uint16_t filter_type;
  uint32_t block_length;
  uint32_t block_start;
  uint8_t *p_local;
  archive_read *ar_local;
  
  rar = (rar5 *)0x0;
  _block_length = p;
  p_local = (uint8_t *)ar;
  _channels = get_context(ar);
  local_44 = parse_filter_data((archive_read *)p_local,_channels,_block_length,
                               &stack0xffffffffffffffdc);
  ar_local._4_4_ = local_44;
  if (((local_44 == L'\0') &&
      (local_44 = parse_filter_data((archive_read *)p_local,_channels,_block_length,&local_28),
      ar_local._4_4_ = local_44, local_44 == L'\0')) &&
     (local_44 = read_bits_16((archive_read *)p_local,_channels,_block_length,
                              (uint16_t *)((long)&filt + 6)), ar_local._4_4_ = local_44,
     local_44 == L'\0')) {
    filt._6_2_ = (ushort)((int)(uint)filt._6_2_ >> 0xd);
    skip_bits(_channels,L'\x03');
    if (((local_28 < 4) || (0x400000 < local_28)) ||
       ((3 < filt._6_2_ ||
        (wVar1 = is_valid_filter_block_start(_channels,uStack_24), wVar1 == L'\0')))) {
      archive_set_error((archive *)p_local,0x54,"Invalid filter encountered");
      ar_local._4_4_ = L'\xffffffe2';
    }
    else {
      rar = (rar5 *)add_new_filter(_channels);
      if (rar == (rar5 *)0x0) {
        archive_set_error((archive *)p_local,0xc,"Can\'t allocate memory for a filter descriptor.");
        ar_local._4_4_ = L'\xffffffe2';
      }
      else {
        rar->header_initialized = (uint)filt._6_2_;
        rar->qlist_offset = (_channels->cstate).write_ptr + (ulong)uStack_24;
        rar->rr_offset = (ulong)local_28;
        (_channels->cstate).last_block_start = rar->qlist_offset;
        (_channels->cstate).last_block_length = rar->rr_offset;
        if (filt._6_2_ == 0) {
          wVar1 = read_consume_bits((archive_read *)p_local,_channels,_block_length,L'\x05',
                                    &local_48);
          if (wVar1 != L'\0') {
            return wVar1;
          }
          rar->skipped_magic = local_48 + L'\x01';
        }
        ar_local._4_4_ = L'\0';
      }
    }
  }
  return ar_local._4_4_;
}

Assistant:

static int parse_filter(struct archive_read* ar, const uint8_t* p) {
	uint32_t block_start, block_length;
	uint16_t filter_type;
	struct filter_info* filt = NULL;
	struct rar5* rar = get_context(ar);
	int ret;

	/* Read the parameters from the input stream. */
	if(ARCHIVE_OK != (ret = parse_filter_data(ar, rar, p, &block_start)))
		return ret;

	if(ARCHIVE_OK != (ret = parse_filter_data(ar, rar, p, &block_length)))
		return ret;

	if(ARCHIVE_OK != (ret = read_bits_16(ar, rar, p, &filter_type)))
		return ret;

	filter_type >>= 13;
	skip_bits(rar, 3);

	/* Perform some sanity checks on this filter parameters. Note that we
	 * allow only DELTA, E8/E9 and ARM filters here, because rest of
	 * filters are not used in RARv5. */

	if(block_length < 4 ||
	    block_length > 0x400000 ||
	    filter_type > FILTER_ARM ||
	    !is_valid_filter_block_start(rar, block_start))
	{
		archive_set_error(&ar->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Invalid filter encountered");
		return ARCHIVE_FATAL;
	}

	/* Allocate a new filter. */
	filt = add_new_filter(rar);
	if(filt == NULL) {
		archive_set_error(&ar->archive, ENOMEM,
		    "Can't allocate memory for a filter descriptor.");
		return ARCHIVE_FATAL;
	}

	filt->type = filter_type;
	filt->block_start = rar->cstate.write_ptr + block_start;
	filt->block_length = block_length;

	rar->cstate.last_block_start = filt->block_start;
	rar->cstate.last_block_length = filt->block_length;

	/* Read some more data in case this is a DELTA filter. Other filter
	 * types don't require any additional data over what was already
	 * read. */
	if(filter_type == FILTER_DELTA) {
		int channels;

		if(ARCHIVE_OK != (ret = read_consume_bits(ar, rar, p, 5, &channels)))
			return ret;

		filt->channels = channels + 1;
	}

	return ARCHIVE_OK;
}